

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient-hostkey-cache.c
# Opt level: O2

void ssh_transient_hostkey_cache_free(ssh_transient_hostkey_cache *thc)

{
  void *ptr;
  
  while( true ) {
    ptr = delpos234(thc->cache,0);
    if (ptr == (void *)0x0) break;
    strbuf_free(*(strbuf **)((long)ptr + 8));
    safefree(ptr);
  }
  freetree234(thc->cache);
  safefree(thc);
  return;
}

Assistant:

void ssh_transient_hostkey_cache_free(ssh_transient_hostkey_cache *thc)
{
    struct ssh_transient_hostkey_cache_entry *ent;
    while ((ent = delpos234(thc->cache, 0)) != NULL) {
        strbuf_free(ent->pub_blob);
        sfree(ent);
    }
    freetree234(thc->cache);
    sfree(thc);
}